

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

void __thiscall Liby::Socket::setNonagle(Socket *this,bool flag)

{
  undefined4 in_EAX;
  int iVar1;
  int *piVar2;
  undefined8 *puVar3;
  char *pcVar4;
  int nodelay;
  undefined8 uStack_18;
  
  if (this->isUdp_ == true) {
    __assert_fail("!isUdp_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Socket.cpp"
                  ,100,"void Liby::Socket::setNonagle(bool)");
  }
  uStack_18 = (ulong)CONCAT14(flag,in_EAX);
  iVar1 = setsockopt(this->fd_,6,1,(void *)((long)&uStack_18 + 4),4);
  if (-1 < iVar1) {
    return;
  }
  piVar2 = __errno_location();
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  pcVar4 = strerror(*piVar2);
  *puVar3 = pcVar4;
  __cxa_throw(puVar3,&char*::typeinfo,0);
}

Assistant:

void Socket::setNonagle(bool flag) {
    assert(!isUdp_);
    int nodelay = flag ? 1 : 0;
    if (::setsockopt(fd_, IPPROTO_TCP, TCP_NODELAY, &nodelay, sizeof(int)) <
        0) {
        throw_err();
    }
}